

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O0

QSize __thiscall QWidgetItem::minimumSize(QWidgetItem *this)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  QSize priv;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffc8;
  QSize *in_stack_ffffffffffffffd0;
  QWidget *size;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  size = in_RDI;
  uVar3 = (**(code **)(*(long *)in_RDI + 0x40))();
  if ((uVar3 & 1) == 0) {
    bVar2 = QWidget::testAttribute
                      (in_RDI,(WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if (bVar2) {
      local_10 = qSmartMinSize((QWidgetItem *)in_RDI);
    }
    else {
      QWidget::d_func((QWidget *)0x346386);
      priv = qSmartMinSize((QWidgetItem *)in_RDI);
      local_10 = toLayoutItemSize((QWidgetPrivate *)priv,(QSize *)size);
    }
  }
  else {
    QSize::QSize(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                 (int)in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QWidgetItem::minimumSize() const
{
    if (isEmpty())
        return QSize(0, 0);
    return !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
           ? toLayoutItemSize(wid->d_func(), qSmartMinSize(this))
           : qSmartMinSize(this);
}